

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::AvgState<double>,double,duckdb::NumericAverageOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  UnifiedVectorFormat idata;
  long *local_68;
  long local_60;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if (*input == (Vector)0x0) {
    lVar3 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      lVar2 = *(long *)(input + 0x28);
      uVar4 = 0;
      uVar5 = 0;
      do {
        if (lVar2 == 0) {
          uVar10 = 0xffffffffffffffff;
        }
        else {
          uVar10 = *(ulong *)(lVar2 + uVar4 * 8);
        }
        uVar7 = uVar5 + 0x40;
        if (count <= uVar5 + 0x40) {
          uVar7 = count;
        }
        uVar8 = uVar7;
        if (uVar10 != 0) {
          uVar8 = uVar5;
          if (uVar10 == 0xffffffffffffffff) {
            lVar11 = uVar7 - uVar5;
            if (uVar5 <= uVar7 && lVar11 != 0) {
              dVar12 = *(double *)(state + 8);
              do {
                dVar12 = dVar12 + *(double *)(lVar3 + uVar5 * 8);
                uVar5 = uVar5 + 1;
              } while (uVar7 != uVar5);
              *(long *)state = lVar11 + *(long *)state;
              *(double *)(state + 8) = dVar12;
              uVar8 = uVar7;
            }
          }
          else if (uVar5 < uVar7) {
            uVar8 = 0;
            do {
              if ((uVar10 >> (uVar8 & 0x3f) & 1) != 0) {
                *(long *)state = *(long *)state + 1;
                *(double *)(state + 8) =
                     *(double *)(lVar3 + uVar5 * 8 + uVar8 * 8) + *(double *)(state + 8);
              }
              uVar8 = uVar8 + 1;
            } while ((uVar5 - uVar7) + uVar8 != 0);
            uVar8 = uVar5 + uVar8;
          }
        }
        uVar5 = uVar8;
        uVar4 = uVar4 + 1;
      } while (uVar4 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      pdVar1 = *(double **)(input + 0x20);
      *(idx_t *)state = *(long *)state + count;
      *(double *)(state + 8) = (double)(long)count * *pdVar1 + *(double *)(state + 8);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_58 == 0) {
      if (count != 0) {
        dVar12 = *(double *)(state + 8);
        iVar6 = 0;
        do {
          iVar9 = iVar6;
          if (*local_68 != 0) {
            iVar9 = (idx_t)*(uint *)(*local_68 + iVar6 * 4);
          }
          dVar12 = dVar12 + *(double *)(local_60 + iVar9 * 8);
          iVar6 = iVar6 + 1;
        } while (count != iVar6);
        *(idx_t *)state = *(long *)state + count;
        *(double *)(state + 8) = dVar12;
      }
    }
    else if (count != 0) {
      lVar3 = *local_68;
      iVar6 = 0;
      do {
        iVar9 = iVar6;
        if (lVar3 != 0) {
          iVar9 = (idx_t)*(uint *)(lVar3 + iVar6 * 4);
        }
        if ((*(ulong *)(local_58 + (iVar9 >> 6) * 8) >> (iVar9 & 0x3f) & 1) != 0) {
          *(long *)state = *(long *)state + 1;
          *(double *)(state + 8) = *(double *)(local_60 + iVar9 * 8) + *(double *)(state + 8);
        }
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}